

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall FlowGraph::VerifyLoopGraph(FlowGraph *this)

{
  Loop *this_00;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  code *pcVar2;
  FlowGraph *pFVar3;
  bool bVar4;
  uint uVar5;
  BOOL BVar6;
  Loop *currentLoop;
  undefined4 *puVar7;
  Type *ppFVar8;
  BasicBlock *pBVar9;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  BasicBlock *pBVar10;
  Loop *pLVar11;
  Loop *pLVar12;
  char *message;
  char *error;
  BasicBlock *pBVar13;
  Iterator local_50;
  uint local_3c;
  FlowGraph *local_38;
  
  pBVar13 = this->blockList;
  if (pBVar13 == (BasicBlock *)0x0) {
    return;
  }
  local_38 = this;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
LAB_00412784:
  if ((pBVar13->field_0x18 & 1) == 0) {
    this_00 = pBVar13->loop;
    local_50.list =
         &(pBVar13->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    local_50.current = &(local_50.list)->super_SListNodeBase<Memory::ArenaAllocator>;
LAB_004127a1:
    if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_50.current ==
        (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) goto LAB_00412a7a;
      *puVar7 = 0;
    }
    pFVar3 = local_38;
    pSVar1 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
             (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)&(local_50.current)->next
              )->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if (pSVar1 == local_50.list) goto LAB_0041295b;
    local_50.current = (NodeBase *)pSVar1;
    ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_50);
    pBVar10 = (*ppFVar8)->succBlock;
    if (pBVar10 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xf6f,"(succ)","succ");
      if (!bVar4) goto LAB_00412a7a;
      *puVar7 = 0;
    }
    pLVar11 = pBVar10->loop;
    if (this_00 == pLVar11) goto LAB_004128b7;
    if ((*(ushort *)&pBVar10->field_0x18 & 4) != 0) {
      if (pLVar11->parent != this_00) {
        do {
          pLVar11 = pLVar11->parent;
          if (pLVar11 == this_00) break;
        } while (pLVar11 != (Loop *)0x0);
        if (pLVar11 != (Loop *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          uVar5 = 0xf79;
          error = "(succ->loop->parent == loop || (!loop->IsDescendentOrSelf(succ->loop)))";
          message = "succ->loop->parent == loop || (!loop->IsDescendentOrSelf(succ->loop))";
          goto LAB_0041293e;
        }
      }
      goto LAB_004127a1;
    }
    if (pLVar11 == (Loop *)0x0) goto LAB_004127a1;
    pLVar12 = this_00;
    if (this_00 != (Loop *)0x0) {
      do {
        pLVar12 = pLVar12->parent;
        if (pLVar12 == pLVar11) break;
      } while (pLVar12 != (Loop *)0x0);
      if (pLVar12 != (Loop *)0x0) goto LAB_004127a1;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    uVar5 = 0xf7c;
    error = "(succ->loop == nullptr || succ->loop->IsDescendentOrSelf(loop))";
    message = "succ->loop == nullptr || succ->loop->IsDescendentOrSelf(loop)";
    goto LAB_0041293e;
  }
  goto LAB_00412a5f;
LAB_0041295b:
  this_01 = JITTimeWorkItem::GetJITFunctionBody(local_38->func->m_workItem);
  local_3c = JITTimeFunctionBody::GetSourceContextId(this_01);
  this_02 = JITTimeWorkItem::GetJITTimeInfo(pFVar3->func->m_workItem);
  uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,RemoveBreakBlockPhase,local_3c,uVar5);
  if ((((!bVar4) && (this_00 != (Loop *)0x0)) && ((pBVar13->field_0x18 & 4) == 0)) &&
     ((BVar6 = Func::HasTry(local_38->func), pBVar10 = pBVar13, BVar6 == 0 ||
      (bVar4 = Func::DoOptimizeTry(local_38->func), bVar4)))) {
    do {
      pBVar10 = pBVar10->prev;
    } while ((pBVar10->field_0x18 & 1) != 0);
    pLVar11 = pBVar10->loop;
    bVar4 = pLVar11 != (Loop *)0x0;
    if (pLVar11 != this_00 && bVar4) {
      do {
        pLVar11 = pLVar11->parent;
        bVar4 = pLVar11 != (Loop *)0x0;
        if (pLVar11 == this_00) break;
      } while (pLVar11 != (Loop *)0x0);
    }
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xf84,"(loop->IsDescendentOrSelf(block->GetPrev()->loop))",
                         "loop->IsDescendentOrSelf(block->GetPrev()->loop)");
      if (!bVar4) {
LAB_00412a7a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
  }
LAB_00412a5f:
  pBVar13 = pBVar13->next;
  if (pBVar13 == (BasicBlock *)0x0) {
    return;
  }
  goto LAB_00412784;
LAB_004128b7:
  if (((*(ushort *)&pBVar10->field_0x18 & 4) == 0) ||
     (pBVar9 = Loop::GetHeadBlock(this_00), pBVar9 == pBVar10)) goto LAB_004127a1;
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar7 = 1;
  uVar5 = 0xf73;
  error = "(succ->isLoopHeader == false || loop->GetHeadBlock() == succ)";
  message = "succ->isLoopHeader == false || loop->GetHeadBlock() == succ";
LAB_0041293e:
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                     ,uVar5,error,message);
  if (!bVar4) goto LAB_00412a7a;
  *puVar7 = 0;
  goto LAB_004127a1;
}

Assistant:

void
FlowGraph::VerifyLoopGraph()
{
    FOREACH_BLOCK(block, this)
    {
        Loop *loop = block->loop;
        FOREACH_SUCCESSOR_BLOCK(succ, block)
        {
            if (loop == succ->loop)
            {
                Assert(succ->isLoopHeader == false || loop->GetHeadBlock() == succ);
                continue;
            }
            if (succ->isLoopHeader)
            {
                Assert(succ->loop->parent == loop
                    || (!loop->IsDescendentOrSelf(succ->loop)));
                continue;
            }
            Assert(succ->loop == nullptr || succ->loop->IsDescendentOrSelf(loop));
        } NEXT_SUCCESSOR_BLOCK;

        if (!PHASE_OFF(Js::RemoveBreakBlockPhase, this->GetFunc()))
        {
            // Make sure all break blocks have been removed.
            if (loop && !block->isLoopHeader && !(this->func->HasTry() && !this->func->DoOptimizeTry()))
            {
                Assert(loop->IsDescendentOrSelf(block->GetPrev()->loop));
            }
        }
    } NEXT_BLOCK;
}